

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::Parser(Parser *this,Parser *that)

{
  code *pcVar1;
  undefined8 uVar2;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  char msg [76];
  stack<c4::yml::Parser::State,_16UL> *in_stack_fffffffffffffec8;
  Parser *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  Location *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  Location *in_stack_fffffffffffffef0;
  char (*msg_00) [25];
  long *plVar5;
  undefined4 *puVar6;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_t in_stack_ffffffffffffff68;
  Parser *in_stack_ffffffffffffff70;
  stack<c4::yml::Parser::State,_16UL> *local_30;
  Parser *pPStack_28;
  char *local_20;
  Location *pLStack_18;
  char *local_10;
  
  *in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RSI + 2);
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RSI + 4);
  *(undefined8 *)(in_RDI + 6) = *(undefined8 *)(in_RSI + 6);
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RSI + 10);
  *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(in_RSI + 0xc);
  msg_00 = (char (*) [25])(in_RDI + 0xe);
  detail::stack<c4::yml::Parser::State,_16UL>::stack
            ((stack<c4::yml::Parser::State,_16UL> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  plVar5 = (long *)(in_RDI + 0x27c);
  puVar6 = in_RDI + 0xe;
  if (*(long *)(in_RDI + 0x270) == 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (size_t)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    loc.super_LineCol.line = (size_t)puVar6;
    loc.super_LineCol.offset = (size_t)plVar5;
    loc.super_LineCol.col._0_4_ = in_stack_ffffffffffffff40;
    loc.super_LineCol.col._4_4_ = in_stack_ffffffffffffff44;
    loc.name.str._0_4_ = in_stack_ffffffffffffff48;
    loc.name.str._4_4_ = in_stack_ffffffffffffff4c;
    loc.name.len._0_4_ = in_stack_ffffffffffffff50;
    loc.name.len._4_4_ = in_stack_ffffffffffffff54;
    error<25ul>(msg_00,loc);
    in_stack_fffffffffffffec8 = local_30;
    in_stack_fffffffffffffed0 = pPStack_28;
    in_stack_fffffffffffffed8 = local_20;
    in_stack_fffffffffffffee0 = pLStack_18;
    in_stack_fffffffffffffee8 = local_10;
  }
  *plVar5 = *(long *)(puVar6 + 0x260) + (*(long *)(puVar6 + 0x262) + -1) * 0x98;
  *(undefined8 *)(in_RDI + 0x27e) = *(undefined8 *)(in_RSI + 0x27e);
  *(undefined8 *)(in_RDI + 0x280) = *(undefined8 *)(in_RSI + 0x280);
  uVar2 = *(undefined8 *)(in_RSI + 0x284);
  *(undefined8 *)(in_RDI + 0x282) = *(undefined8 *)(in_RSI + 0x282);
  *(undefined8 *)(in_RDI + 0x284) = uVar2;
  uVar2 = *(undefined8 *)(in_RSI + 0x288);
  *(undefined8 *)(in_RDI + 0x286) = *(undefined8 *)(in_RSI + 0x286);
  *(undefined8 *)(in_RDI + 0x288) = uVar2;
  *(undefined8 *)(in_RDI + 0x28a) = *(undefined8 *)(in_RSI + 0x28a);
  uVar2 = *(undefined8 *)(in_RSI + 0x28e);
  *(undefined8 *)(in_RDI + 0x28c) = *(undefined8 *)(in_RSI + 0x28c);
  *(undefined8 *)(in_RDI + 0x28e) = uVar2;
  *(byte *)(in_RDI + 0x290) = *(byte *)(in_RSI + 0x290) & 1;
  *(undefined8 *)(in_RDI + 0x292) = *(undefined8 *)(in_RSI + 0x292);
  uVar2 = *(undefined8 *)(in_RSI + 0x296);
  *(undefined8 *)(in_RDI + 0x294) = *(undefined8 *)(in_RSI + 0x294);
  *(undefined8 *)(in_RDI + 0x296) = uVar2;
  *(undefined8 *)(in_RDI + 0x298) = *(undefined8 *)(in_RSI + 0x298);
  uVar2 = *(undefined8 *)(in_RSI + 0x29c);
  *(undefined8 *)(in_RDI + 0x29a) = *(undefined8 *)(in_RSI + 0x29a);
  *(undefined8 *)(in_RDI + 0x29c) = uVar2;
  basic_substring<char>::basic_substring((basic_substring<char> *)(in_RDI + 0x29e));
  *(undefined8 *)(in_RDI + 0x2a2) = 0;
  *(undefined8 *)(in_RDI + 0x2a4) = 0;
  *(undefined8 *)(in_RDI + 0x2a6) = 0;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)(in_RDI + 0x2a8));
  if (*(long *)(in_RSI + 0x2a6) != 0) {
    _resize_locations(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    if (*(long *)(in_RDI + 0x2a6) != *(long *)(in_RSI + 0x2a6)) {
      memcpy(&stack0xffffffffffffff68,
             "check failed: m_newline_offsets_capacity == that.m_newline_offsets_capacity",0x4c);
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x27a);
      Location::Location(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (size_t)in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8,
                         (size_t)in_stack_fffffffffffffed0);
      (*pcVar1)(&stack0xffffffffffffff68,0x4c,*(undefined8 *)(in_RDI + 0x274));
    }
    memcpy(*(void **)(in_RDI + 0x2a2),*(void **)(in_RSI + 0x2a2),*(long *)(in_RSI + 0x2a4) << 3);
    *(undefined8 *)(in_RDI + 0x2a4) = *(undefined8 *)(in_RSI + 0x2a4);
  }
  if (*(long *)(in_RSI + 0x2a0) != 0) {
    _resize_filter_arena(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

Parser::Parser(Parser const& that)
    : m_options(that.m_options)
    , m_file(that.m_file)
    , m_buf(that.m_buf)
    , m_root_id(that.m_root_id)
    , m_tree(that.m_tree)
    , m_stack(that.m_stack)
    , m_state(&m_stack.top())
    , m_key_tag_indentation(that.m_key_tag_indentation)
    , m_key_tag2_indentation(that.m_key_tag2_indentation)
    , m_key_tag(that.m_key_tag)
    , m_key_tag2(that.m_key_tag2)
    , m_val_tag_indentation(that.m_val_tag_indentation)
    , m_val_tag(that.m_val_tag)
    , m_key_anchor_was_before(that.m_key_anchor_was_before)
    , m_key_anchor_indentation(that.m_key_anchor_indentation)
    , m_key_anchor(that.m_key_anchor)
    , m_val_anchor_indentation(that.m_val_anchor_indentation)
    , m_val_anchor(that.m_val_anchor)
    , m_filter_arena()
    , m_newline_offsets()
    , m_newline_offsets_size()
    , m_newline_offsets_capacity()
    , m_newline_offsets_buf()
{
    if(that.m_newline_offsets_capacity)
    {
        _resize_locations(that.m_newline_offsets_capacity);
        _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity == that.m_newline_offsets_capacity);
        memcpy(m_newline_offsets, that.m_newline_offsets, that.m_newline_offsets_size * sizeof(size_t));
        m_newline_offsets_size = that.m_newline_offsets_size;
    }
    if(that.m_filter_arena.len)
    {
        _resize_filter_arena(that.m_filter_arena.len);
    }
}